

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)38,_(unsigned_short)5>::Unpack
               (uint32_t **in,uint64_t *out)

{
  ulong uVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar3 = *in;
  uVar2 = *puVar3;
  out[5] = (ulong)(uVar2 >> 0x1e);
  *in = puVar3 + 1;
  uVar1 = (ulong)(uVar2 >> 0x1e) + (ulong)puVar3[1] * 4;
  out[5] = uVar1;
  *in = puVar3 + 2;
  out[5] = (ulong)(puVar3[2] & 0xf) << 0x22 | uVar1;
  Unroller<(unsigned_short)38,_(unsigned_short)6>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}